

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O0

int Sbd_ManCutCollect_rec
              (Gia_Man_t *p,Vec_Int_t *vMirrors,int iObj,int LevStop,Vec_Int_t *vLutLevs,
              Vec_Int_t *vCut)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj_00;
  bool local_49;
  int Ret1;
  int Ret0;
  Gia_Obj_t *pObj;
  Vec_Int_t *vCut_local;
  Vec_Int_t *vLutLevs_local;
  int LevStop_local;
  int iObj_local;
  Vec_Int_t *vMirrors_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntEntry(vMirrors,iObj);
  vLutLevs_local._4_4_ = iObj;
  if (-1 < iVar1) {
    iVar1 = Vec_IntEntry(vMirrors,iObj);
    vLutLevs_local._4_4_ = Abc_Lit2Var(iVar1);
  }
  if ((vLutLevs_local._4_4_ == 0) ||
     (iVar1 = Gia_ObjIsTravIdCurrentId(p,vLutLevs_local._4_4_), iVar1 != 0)) {
    p_local._4_4_ = 1;
  }
  else {
    Gia_ObjSetTravIdCurrentId(p,vLutLevs_local._4_4_);
    pObj_00 = Gia_ManObj(p,vLutLevs_local._4_4_);
    iVar1 = Gia_ObjIsCi(pObj_00);
    if ((iVar1 == 0) && (iVar1 = Vec_IntEntry(vLutLevs,vLutLevs_local._4_4_), LevStop < iVar1)) {
      iVar1 = Gia_ObjIsAnd(pObj_00);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                      ,0xf9,
                      "int Sbd_ManCutCollect_rec(Gia_Man_t *, Vec_Int_t *, int, int, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar1 = Gia_ObjFaninId0(pObj_00,vLutLevs_local._4_4_);
      iVar1 = Sbd_ManCutCollect_rec(p,vMirrors,iVar1,LevStop,vLutLevs,vCut);
      iVar2 = Gia_ObjFaninId1(pObj_00,vLutLevs_local._4_4_);
      iVar2 = Sbd_ManCutCollect_rec(p,vMirrors,iVar2,LevStop,vLutLevs,vCut);
      local_49 = iVar1 != 0 && iVar2 != 0;
      p_local._4_4_ = (uint)local_49;
    }
    else {
      Vec_IntPush(vCut,vLutLevs_local._4_4_);
      iVar1 = Vec_IntEntry(vLutLevs,vLutLevs_local._4_4_);
      p_local._4_4_ = (uint)(iVar1 <= LevStop);
    }
  }
  return p_local._4_4_;
}

Assistant:

int Sbd_ManCutCollect_rec( Gia_Man_t * p, Vec_Int_t * vMirrors, int iObj, int LevStop, Vec_Int_t * vLutLevs, Vec_Int_t * vCut )
{
    Gia_Obj_t * pObj; 
    int Ret0, Ret1;
    if ( Vec_IntEntry(vMirrors, iObj) >= 0 )
        iObj = Abc_Lit2Var(Vec_IntEntry(vMirrors, iObj));
    if ( !iObj || Gia_ObjIsTravIdCurrentId(p, iObj) )
        return 1;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) || Vec_IntEntry(vLutLevs, iObj) <= LevStop )
    {
        Vec_IntPush( vCut, iObj );
        return Vec_IntEntry(vLutLevs, iObj) <= LevStop;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Ret0 = Sbd_ManCutCollect_rec( p, vMirrors, Gia_ObjFaninId0(pObj, iObj), LevStop, vLutLevs, vCut );
    Ret1 = Sbd_ManCutCollect_rec( p, vMirrors, Gia_ObjFaninId1(pObj, iObj), LevStop, vLutLevs, vCut );
    return Ret0 && Ret1;
}